

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# animations.cpp
# Opt level: O0

void __thiscall FTextureManager::UpdateAnimations(FTextureManager *this,DWORD mstime)

{
  FAnimDef *this_00;
  uint uVar1;
  FTextureID fromtexnum;
  FTextureID totexnum;
  FAnimDef **ppFVar2;
  uint local_30;
  uint i;
  WORD local_22;
  WORD rndFrame;
  FAnimDef *anim;
  uint j;
  DWORD mstime_local;
  FTextureManager *this_local;
  
  for (anim._0_4_ = 0; uVar1 = TArray<FAnimDef_*,_FAnimDef_*>::Size(&this->mAnimations),
      (uint)anim < uVar1; anim._0_4_ = (uint)anim + 1) {
    ppFVar2 = TArray<FAnimDef_*,_FAnimDef_*>::operator[](&this->mAnimations,(ulong)(uint)anim);
    this_00 = *ppFVar2;
    if (this_00->SwitchTime == 0) {
      FAnimDef::SetSwitchTime(this_00,mstime);
    }
    else {
      while (this_00->SwitchTime <= mstime) {
        switch(this_00->AnimType) {
        default:
          this_00->CurFrame =
               (WORD)((ulong)(this_00->CurFrame + 1) % (ulong)(long)(int)(uint)this_00->NumFrames);
          break;
        case '\x01':
          if (this_00->CurFrame == 0) {
            this_00->CurFrame = this_00->NumFrames - 1;
          }
          else {
            this_00->CurFrame = this_00->CurFrame - 1;
          }
          break;
        case '\x02':
          this_00->CurFrame = this_00->CurFrame + 1;
          if ((int)(this_00->NumFrames - 1) <= (int)(uint)this_00->CurFrame) {
            this_00->AnimType = '\x03';
          }
          break;
        case '\x03':
          this_00->CurFrame = this_00->CurFrame - 1;
          if (this_00->CurFrame == 0) {
            this_00->AnimType = '\x02';
          }
          break;
        case '\x04':
          if (1 < this_00->NumFrames) {
            uVar1 = FRandom::operator()(&pr_animatepictures,this_00->NumFrames - 1);
            local_22 = (WORD)uVar1;
            if ((uint)this_00->CurFrame <= (uVar1 & 0xffff)) {
              local_22 = local_22 + 1;
            }
            this_00->CurFrame = local_22;
          }
        }
        FAnimDef::SetSwitchTime(this_00,mstime);
      }
    }
    if ((this_00->bDiscrete & 1U) == 0) {
      for (local_30 = 0; local_30 < this_00->NumFrames; local_30 = local_30 + 1) {
        fromtexnum = FTextureID::operator+(&this_00->BasePic,local_30);
        totexnum = FTextureID::operator+
                             (&this_00->BasePic,
                              (local_30 + this_00->CurFrame) % (uint)this_00->NumFrames);
        SetTranslation(this,fromtexnum,totexnum);
      }
    }
    else {
      SetTranslation(this,(FTextureID)(this_00->BasePic).texnum,
                     (FTextureID)this_00->Frames[this_00->CurFrame].FramePic.texnum);
    }
  }
  return;
}

Assistant:

void FTextureManager::UpdateAnimations (DWORD mstime)
{
	for (unsigned int j = 0; j < mAnimations.Size(); ++j)
	{
		FAnimDef *anim = mAnimations[j];

		// If this is the first time through R_UpdateAnimations, just
		// initialize the anim's switch time without actually animating.
		if (anim->SwitchTime == 0)
		{
			anim->SetSwitchTime (mstime);
		}
		else while (anim->SwitchTime <= mstime)
		{ // Multiple frames may have passed since the last time calling
		  // R_UpdateAnimations, so be sure to loop through them all.

			switch (anim->AnimType)
			{
			default:
			case FAnimDef::ANIM_Forward:
				anim->CurFrame = (anim->CurFrame + 1) % anim->NumFrames;
				break;

			case FAnimDef::ANIM_Backward:
				if (anim->CurFrame == 0)
				{
					anim->CurFrame = anim->NumFrames - 1;
				}
				else
				{
					anim->CurFrame -= 1;
				}
				break;

			case FAnimDef::ANIM_Random:
				// select a random frame other than the current one
				if (anim->NumFrames > 1)
				{
					WORD rndFrame = (WORD)pr_animatepictures(anim->NumFrames - 1);
					if (rndFrame >= anim->CurFrame) rndFrame++;
					anim->CurFrame = rndFrame;
				}
				break;

			case FAnimDef::ANIM_OscillateUp:
				anim->CurFrame = anim->CurFrame + 1;
				if (anim->CurFrame >= anim->NumFrames - 1)
				{
					anim->AnimType = FAnimDef::ANIM_OscillateDown;
				}
				break;

			case FAnimDef::ANIM_OscillateDown:
				anim->CurFrame = anim->CurFrame - 1;
				if (anim->CurFrame == 0)
				{
					anim->AnimType = FAnimDef::ANIM_OscillateUp;
				}
				break;
			}
			anim->SetSwitchTime (mstime);
		}

		if (anim->bDiscrete)
		{
			SetTranslation (anim->BasePic, anim->Frames[anim->CurFrame].FramePic);
		}
		else
		{
			for (unsigned int i = 0; i < anim->NumFrames; i++)
			{
				SetTranslation (anim->BasePic + i, anim->BasePic + (i + anim->CurFrame) % anim->NumFrames);
			}
		}
	}
}